

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

pair<unsigned_long,_bool> __thiscall
detail::
try_get_range_size<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
          (detail *this,span<const_std::byte> buffer)

{
  ulong uVar1;
  byte **ppbVar2;
  size_t sVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  pair<unsigned_long,_bool> pVar5;
  bool local_69;
  long local_68;
  bool local_59;
  unsigned_long local_58;
  ulong local_50;
  unsigned_long elements_size;
  unsigned_long local_40;
  unsigned_long local_38;
  size_t count;
  byte *data_begin;
  span<const_std::byte> buffer_local;
  undefined1 local_10;
  
  buffer_local.begin_ = buffer.begin_;
  data_begin = (byte *)this;
  ppbVar2 = span<const_std::byte>::begin((span<const_std::byte> *)&data_begin);
  count = (size_t)*ppbVar2;
  sVar3 = span<const_std::byte>::size((span<const_std::byte> *)&data_begin);
  if (sVar3 < 8) {
    local_40 = 0;
    elements_size._7_1_ = 0;
    std::pair<unsigned_long,_bool>::pair<bool,_true>
              ((pair<unsigned_long,_bool> *)&buffer_local.end_,&local_40,
               (bool *)((long)&elements_size + 7));
    uVar4 = extraout_RDX;
  }
  else {
    deserialize<unsigned_long>(&local_38,(span<const_std::byte> *)&data_begin);
    local_50 = local_38 << 3;
    sVar3 = span<const_std::byte>::size((span<const_std::byte> *)&data_begin);
    uVar1 = local_50;
    if (sVar3 < local_50) {
      local_58 = 0;
      local_59 = false;
      std::pair<unsigned_long,_bool>::pair<bool,_true>
                ((pair<unsigned_long,_bool> *)&buffer_local.end_,&local_58,&local_59);
      uVar4 = extraout_RDX_00;
    }
    else {
      ppbVar2 = span<const_std::byte>::begin((span<const_std::byte> *)&data_begin);
      *ppbVar2 = *ppbVar2 + uVar1;
      ppbVar2 = span<const_std::byte>::begin((span<const_std::byte> *)&data_begin);
      local_68 = (long)*ppbVar2 - count;
      local_69 = true;
      std::pair<unsigned_long,_bool>::pair<long,_bool,_true>
                ((pair<unsigned_long,_bool> *)&buffer_local.end_,&local_68,&local_69);
      uVar4 = extraout_RDX_01;
    }
  }
  pVar5._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  pVar5.second = (bool)local_10;
  pVar5.first = (unsigned_long)buffer_local.end_;
  return pVar5;
}

Assistant:

std::pair<size_t, bool> try_get_range_size(span<std::byte const> buffer) noexcept {
        auto const data_begin = buffer.begin();

        size_t count;
        if (buffer.size() < sizeof(count)) return { {}, false };
        deserialize(count, buffer);
        
        using value_type = typename range_traits<T>::value_type;
        if constexpr (serialization_category_v<value_type> == serialization_category::trivial) {
            auto const elements_size = count * sizeof(value_type);
            if (buffer.size() < elements_size) return { {}, false };
            buffer.begin() += elements_size;
        }
        else {
            for (size_t i = 0; i < count; ++i) {
                auto const [size, success] = try_get_deserialized_size<value_type>(buffer);
                if (!success) return { {}, false };
                buffer.begin() += size;
            }
        }
        return { buffer.begin() - data_begin, true };
    }